

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O0

int ReadPNG(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  __jmp_buf_tag *__env;
  ulong uVar6;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  png_bytep row;
  int srgb_intent;
  double screen_gamma;
  double image_gamma;
  uint8_t *rgb;
  int64_t stride;
  png_uint_32 y;
  png_uint_32 height;
  png_uint_32 width;
  int ok;
  int p;
  int num_passes;
  int num_channels;
  int interlaced;
  int bit_depth;
  int color_type;
  PNGReadContext context;
  png_infop end_info;
  png_infop info;
  png_structp png;
  uint8_t *rgb_00;
  WebPPicture *picture;
  int local_c4;
  void *local_b8;
  undefined1 local_ac [4];
  undefined8 local_a8;
  undefined8 local_a0;
  void *local_98;
  uint64_t local_90;
  uint local_88;
  uint local_84;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  long local_60;
  ulong local_58;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  int local_24;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_60,0,0x18);
  local_c4 = 0;
  local_98 = (void *)0x0;
  if (((local_10 == 0) || (local_18 == 0)) || (local_20 == 0)) {
    return 0;
  }
  local_60 = local_10;
  local_58 = local_18;
  local_38 = png_create_read_struct_2("1.6.37",0,0,0,0,MallocFunc,FreeFunc);
  if (local_38 != 0) {
    png_set_error_fn(local_38,0,error_function);
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_38,longjmp,200);
    iVar3 = _setjmp(__env);
    uVar1 = local_18;
    if (iVar3 == 0) {
      uVar6 = png_get_chunk_malloc_max(local_38);
      if ((uVar6 < uVar1) && (local_18 < 0x1000000)) {
        png_set_chunk_malloc_max(local_38,local_18);
      }
      local_40 = png_create_info_struct(local_38);
      if ((local_40 != 0) && (local_48 = png_create_info_struct(local_38), local_48 != 0)) {
        png_set_read_fn(local_38,&local_60,ReadFunc);
        png_read_info(local_38,local_40);
        rgb_00 = &stack0xffffffffffffff94;
        picture = (WebPPicture *)0x0;
        iVar3 = png_get_IHDR(local_38,local_40,&stack0xffffffffffffff80,&local_84,
                             &stack0xffffffffffffff98,&stack0xffffffffffffff9c,rgb_00,0,0);
        if (iVar3 != 0) {
          png_set_strip_16(local_38);
          png_set_packing(local_38);
          if (in_stack_ffffffffffffff9c == 3) {
            png_set_palette_to_rgb(local_38);
          }
          if ((in_stack_ffffffffffffff9c == 0) || (in_stack_ffffffffffffff9c == 4)) {
            if (in_stack_ffffffffffffff98 < 8) {
              png_set_expand_gray_1_2_4_to_8(local_38);
            }
            png_set_gray_to_rgb(local_38);
          }
          iVar3 = png_get_valid(local_38,local_40,0x10);
          if (iVar3 != 0) {
            png_set_tRNS_to_alpha(local_38);
          }
          local_a0 = 0x3fdd1745d1745d17;
          local_a8 = 0x400199999999999a;
          iVar3 = png_get_sRGB(local_38,local_40,local_ac);
          if ((iVar3 != 0) || (iVar3 = png_get_gAMA(local_38,local_40,&local_a0), iVar3 != 0)) {
            png_set_gamma(local_a8,local_a0,local_38);
          }
          if (local_24 == 0) {
            png_set_strip_alpha(local_38);
          }
          iVar3 = png_set_interlace_handling(local_38);
          png_read_update_info(local_38,local_40);
          bVar2 = png_get_channels(local_38,local_40);
          uVar4 = (uint)bVar2;
          if ((((uVar4 == 3) || (uVar4 == 4)) &&
              (local_90 = (long)(int)uVar4 * (ulong)in_stack_ffffffffffffff80,
              local_90 == (long)(int)local_90)) &&
             ((iVar5 = ImgIoUtilCheckSizeArgumentsOverflow(local_90,(ulong)local_84), iVar5 != 0 &&
              (local_98 = malloc(local_90 * local_84), local_98 != (void *)0x0)))) {
            for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
              local_b8 = local_98;
              for (local_88 = 0; local_88 < local_84; local_88 = local_88 + 1) {
                png_read_rows(local_38,&local_b8,0,1);
                local_b8 = (void *)(local_90 + (long)local_b8);
              }
            }
            png_read_end(local_38,local_48);
            if ((local_30 == 0) ||
               (iVar3 = ExtractMetadataFromPNG
                                  ((png_structp)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                   (png_infop)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                                   (png_infop)CONCAT44(iVar3,iVar5),
                                   (Metadata *)CONCAT44(local_c4,in_stack_ffffffffffffff80)),
               iVar3 != 0)) {
              *(uint *)(local_20 + 8) = in_stack_ffffffffffffff80;
              *(uint *)(local_20 + 0xc) = local_84;
              if (uVar4 == 4) {
                local_c4 = WebPPictureImportRGBA(picture,rgb_00,0);
              }
              else {
                local_c4 = WebPPictureImportRGB(picture,rgb_00,0);
              }
              if (local_c4 != 0) goto LAB_00106417;
            }
            else {
              fprintf(stderr,"Error extracting PNG metadata!\n");
            }
          }
        }
      }
    }
    MetadataFree((Metadata *)0x105fbf);
  }
LAB_00106417:
  if (local_38 != 0) {
    png_destroy_read_struct(&local_38,&local_40,&local_48);
  }
  free(local_98);
  return local_c4;
}

Assistant:

int ReadPNG(const uint8_t* const data, size_t data_size,
            struct WebPPicture* const pic,
            int keep_alpha, struct Metadata* const metadata) {
  volatile png_structp png = NULL;
  volatile png_infop info = NULL;
  volatile png_infop end_info = NULL;
  PNGReadContext context = { NULL, 0, 0 };
  int color_type, bit_depth, interlaced;
  int num_channels;
  int num_passes;
  int p;
  volatile int ok = 0;
  png_uint_32 width, height, y;
  int64_t stride;
  uint8_t* volatile rgb = NULL;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  context.data = data;
  context.data_size = data_size;

  png = png_create_read_struct_2(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL,
                                 NULL, MallocFunc, FreeFunc);
  if (png == NULL) goto End;

  png_set_error_fn(png, 0, error_function, NULL);
  if (setjmp(png_jmpbuf(png))) {
 Error:
    MetadataFree(metadata);
    goto End;
  }

#if LOCAL_PNG_PREREQ(1,5) || \
    (LOCAL_PNG_PREREQ(1,4) && PNG_LIBPNG_VER_RELEASE >= 1)
  // If it looks like the bitstream is going to need more memory than libpng's
  // internal limit (default: 8M), try to (reasonably) raise it.
  if (data_size > png_get_chunk_malloc_max(png) && data_size < (1u << 24)) {
    png_set_chunk_malloc_max(png, data_size);
  }
#endif

  info = png_create_info_struct(png);
  if (info == NULL) goto Error;
  end_info = png_create_info_struct(png);
  if (end_info == NULL) goto Error;

  png_set_read_fn(png, &context, ReadFunc);
  png_read_info(png, info);
  if (!png_get_IHDR(png, info,
                    &width, &height, &bit_depth, &color_type, &interlaced,
                    NULL, NULL)) goto Error;

  png_set_strip_16(png);
  png_set_packing(png);
  if (color_type == PNG_COLOR_TYPE_PALETTE) {
    png_set_palette_to_rgb(png);
  }
  if (color_type == PNG_COLOR_TYPE_GRAY ||
      color_type == PNG_COLOR_TYPE_GRAY_ALPHA) {
    if (bit_depth < 8) {
      png_set_expand_gray_1_2_4_to_8(png);
    }
    png_set_gray_to_rgb(png);
  }
  if (png_get_valid(png, info, PNG_INFO_tRNS)) {
    png_set_tRNS_to_alpha(png);
  }

  // Apply gamma correction if needed.
  {
    double image_gamma = 1 / 2.2, screen_gamma = 2.2;
    int srgb_intent;
    if (png_get_sRGB(png, info, &srgb_intent) ||
        png_get_gAMA(png, info, &image_gamma)) {
      png_set_gamma(png, screen_gamma, image_gamma);
    }
  }

  if (!keep_alpha) {
    png_set_strip_alpha(png);
  }

  num_passes = png_set_interlace_handling(png);
  png_read_update_info(png, info);

  num_channels = png_get_channels(png, info);
  if (num_channels != 3 && num_channels != 4) {
    goto Error;
  }
  stride = (int64_t)num_channels * width * sizeof(*rgb);
  if (stride != (int)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, height)) {
    goto Error;
  }

  rgb = (uint8_t*)malloc((size_t)stride * height);
  if (rgb == NULL) goto Error;
  for (p = 0; p < num_passes; ++p) {
    png_bytep row = rgb;
    for (y = 0; y < height; ++y) {
      png_read_rows(png, &row, NULL, 1);
      row += stride;
    }
  }
  png_read_end(png, end_info);

  if (metadata != NULL &&
      !ExtractMetadataFromPNG(png, info, end_info, metadata)) {
    fprintf(stderr, "Error extracting PNG metadata!\n");
    goto Error;
  }

  pic->width = (int)width;
  pic->height = (int)height;
  ok = (num_channels == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                           : WebPPictureImportRGB(pic, rgb, (int)stride);

  if (!ok) {
    goto Error;
  }

 End:
  if (png != NULL) {
    png_destroy_read_struct((png_structpp)&png,
                            (png_infopp)&info, (png_infopp)&end_info);
  }
  free(rgb);
  return ok;
}